

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O3

void twiddle(fft_data *vec,int N,int radix)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  vec->re = 1.0;
  vec->im = 0.0;
  if (1 < (int)((long)N / (long)radix)) {
    pdVar1 = &vec[1].im;
    uVar2 = 1;
    do {
      dVar3 = (double)(int)uVar2 * (6.283185307179586 / (double)N);
      dVar4 = cos(dVar3);
      ((fft_data *)(pdVar1 + -1))->re = dVar4;
      dVar3 = sin(dVar3);
      *pdVar1 = -dVar3;
      uVar2 = uVar2 + 1;
      pdVar1 = pdVar1 + 2;
    } while (((long)N / (long)radix & 0xffffffffU) != uVar2);
  }
  return;
}

Assistant:

void twiddle(fft_data *vec,int N, int radix) {
	int K,KL;
	fft_type theta,theta2;
	theta = PI2/N;
	KL = N/radix;
	vec[0].re = 1.0;
	vec[0].im = 0.0;

	for (K = 1; K < KL;K++) {
		theta2 = theta * K;
		vec[K].re = cos(theta2);
		vec[K].im = -sin(theta2);
	}

}